

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  int in_R8D;
  Mat src_2;
  Mat src_1;
  Mat src;
  int type_to;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int _h;
  uchar *in_stack_fffffffffffffe98;
  int _w;
  Mat *in_stack_fffffffffffffea0;
  Mat *this_00;
  uint local_11c;
  Mat local_110;
  Mat local_c8;
  Mat local_70;
  uint local_24;
  
  if ((*(int *)(in_RDI + 0x2c) == in_ECX) && (*(int *)(in_RDI + 0x30) == in_R8D)) {
    to_pixels(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  }
  else {
    if ((in_EDX & 0xffff0000) == 0) {
      local_11c = in_EDX & 0xffff;
    }
    else {
      local_11c = (int)in_EDX >> 0x10;
    }
    local_24 = local_11c;
    _h = (int)in_stack_fffffffffffffe98;
    _w = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if ((local_11c == 1) || (local_11c == 2)) {
      Mat(in_stack_fffffffffffffea0,_w,_h,
          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe8c,
          (Allocator *)0x14bf1e);
      operator_cast_to_unsigned_char_(&local_70);
      to_pixels(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      operator_cast_to_unsigned_char_(&local_70);
      resize_bilinear_c3((uchar *)src_2._56_8_,src_2.d,src_2.h,src_2.w,(uchar *)src_2.allocator,
                         src_2._28_4_,(int)src_1.data,(int)src_1.refcount);
      ~Mat((Mat *)0x14bfae);
    }
    else if (local_11c == 3) {
      Mat(in_stack_fffffffffffffea0,_w,_h,
          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe8c,
          (Allocator *)0x14c014);
      operator_cast_to_unsigned_char_(&local_c8);
      to_pixels(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      operator_cast_to_unsigned_char_(&local_c8);
      resize_bilinear_c1((uchar *)src_2._56_8_,src_2.d,src_2.h,src_2.w,(uchar *)src_2.allocator,
                         src_2._28_4_,(int)src_1.data,(int)src_1.refcount);
      ~Mat((Mat *)0x14c09f);
    }
    else if ((local_11c == 4) || (local_11c == 5)) {
      this_00 = &local_110;
      Mat(this_00,_w,_h,CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
          in_stack_fffffffffffffe8c,(Allocator *)0x14c10c);
      operator_cast_to_unsigned_char_(this_00);
      to_pixels(this_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      operator_cast_to_unsigned_char_(&local_110);
      resize_bilinear_c4((uchar *)src_2._56_8_,src_2.d,src_2.h,src_2.w,(uchar *)src_2.allocator,
                         src_2._28_4_,(int)src_1.data,(int)src_1.refcount);
      ~Mat((Mat *)0x14c196);
    }
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}